

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O2

int __thiscall s_i::peek(s_i *this,size_t n)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  char *p;
  
  if (this->utf8 == true) {
    p = this->i;
    iVar1 = -1;
    while( true ) {
      pcVar2 = (this->s->_M_dataplus)._M_p + this->s->_M_string_length;
      bVar3 = n == 0;
      n = n - 1;
      if (bVar3) break;
      if (pcVar2 <= this->i) {
        return -1;
      }
      read_UTF8_ch(&p);
    }
    if (this->i < pcVar2) {
      iVar1 = read_UTF8_ch((char *)0x10a62e);
    }
  }
  else if (this->i + (n - (long)(this->s->_M_dataplus)._M_p) < (char *)this->s->_M_string_length) {
    iVar1 = (int)this->i[n];
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int peek(size_t n = 0) {
        if (utf8) {
            const char* p = i;
            while (n--) {
                if (atEnd())
                    return -1;
                read_UTF8_ch(&p);
            }
            if (atEnd())
                return -1;
            return read_UTF8_ch(p);
        } else {
            if (n + ind() >= s.size()) return -1;
            return i[n];
        }
    }